

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brecovery.cpp
# Opt level: O3

bool __thiscall
anon_unknown.dwarf_1eb68::checkEntryBuffer
          (anon_unknown_dwarf_1eb68 *this,vector<char,_std::allocator<char>_> *buffer)

{
  uint uVar1;
  Range range;
  timespec ts;
  Range local_108 [13];
  
  local_108[0]._begin = (char *)this;
  local_108[0]._end = (char *)buffer;
  if ((anon_unknown_dwarf_1eb68 *)buffer != this) {
    do {
      binlog::Range::throw_if_overflow(local_108,4);
      uVar1 = *(uint *)local_108[0]._begin;
      local_108[0]._begin = local_108[0]._begin + 4;
      binlog::Range::throw_if_overflow(local_108,(ulong)uVar1);
      local_108[0]._begin = local_108[0]._begin + uVar1;
    } while (local_108[0]._begin != local_108[0]._end);
  }
  return true;
}

Assistant:

void showHelp()
{
  std::cout <<
    "brecovery -- extract unconsumed binlog data from a memory dump\n"
    "\n"
    "Synopsis:\n"
    "  brecovery corefile [outputfile]\n"
    "\n"
    "Arguments:\n"
    "  corefile        Path to a corefile (memory dump)\n"
    "  outputfile      Path to write recovered data. If '-' or unspecified, read from stdin\n"
    "\n"
    "Notes:\n"
    "  Recovery is done by looking for 'magic numbers' in the corefile,\n"
    "  and extracting structured data following those. Metadata and unconsumed data\n"
    "  are extracted from each session, and written to the output.\n"
    "  The output is a valid binlog logfile (if it was not corrupted previously),\n"
    "  and can be read using bread:\n"
    "\n"
    "    $ brecovery app.core recovered.blog\n"
    "    $ bread recovered.blog\n"
    "\n"
    "Report bugs to:\n"
    "  https://github.com/Morgan-Stanley/binlog/issues\n";
    ;
}